

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

void idx2::AllocPtr<idx2::hash_table<short,idx2::bitstream>::bucket_status>
               (bucket_status **Ptr,i64 Size,allocator *Alloc)

{
  buffer local_38;
  
  Mallocator();
  local_38.Data = (bucket_status *)0x0;
  local_38.Bytes = 0;
  local_38.Alloc = &Mallocator::Instance.super_allocator;
  AllocBuf(&local_38,Size,Alloc);
  *Ptr = local_38.Data;
  return;
}

Assistant:

void
AllocPtr(t** Ptr, i64 Size, allocator* Alloc = &Mallocator())
{
  buffer RawBuf;
  AllocBuf(&RawBuf, i64(Size * sizeof(t)), Alloc);
  *Ptr = (t*)RawBuf.Data;
}